

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::VersionSet::ReuseManifest(VersionSet *this,string *dscname,string *dscbase)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  Writer *this_00;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Status r;
  uint64_t manifest_size;
  uint64_t manifest_number;
  FileType manifest_type;
  Options *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  uint64_t *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  Logger *pLVar7;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  bool local_51;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  ulong in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI[5] + 0x54) & 1) == 0) {
    local_51 = false;
  }
  else {
    bVar3 = ParseFileName(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                          (FileType *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20))
    ;
    bVar2 = false;
    bVar4 = true;
    if ((bVar3) && (bVar4 = true, local_2c == 3)) {
      (**(code **)(*(long *)*in_RDI + 0x58))
                (local_48,(long *)*in_RDI,in_RSI,&stack0xffffffffffffffc0);
      bVar2 = true;
      bVar3 = Status::ok((Status *)in_stack_ffffffffffffff18);
      bVar4 = true;
      if (bVar3) {
        sVar5 = TargetFileSize(in_stack_ffffffffffffff18);
        bVar4 = sVar5 <= in_stack_ffffffffffffffc0;
      }
    }
    if (bVar2) {
      Status::~Status((Status *)in_stack_ffffffffffffff18);
    }
    if (bVar4) {
      local_51 = false;
    }
    else {
      if (in_RDI[0xe] != 0) {
        __assert_fail("descriptor_file_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                      ,0x3ee,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
      if (in_RDI[0xf] != 0) {
        __assert_fail("descriptor_log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                      ,0x3ef,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
      (**(code **)(*(long *)*in_RDI + 0x28))(local_50,(long *)*in_RDI,in_RSI,in_RDI + 0xe);
      bVar4 = Status::ok((Status *)in_stack_ffffffffffffff18);
      if (bVar4) {
        pLVar7 = *(Logger **)(in_RDI[5] + 0x18);
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff18);
        Log(pLVar7,"Reusing MANIFEST %s\n",pcVar6);
        this_00 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_00,(WritableFile *)
                                    CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                            (uint64_t)in_stack_ffffffffffffff18);
        in_RDI[0xf] = this_00;
        in_RDI[10] = in_stack_ffffffffffffffc8;
        local_51 = true;
      }
      else {
        pLVar7 = *(Logger **)(in_RDI[5] + 0x18);
        Status::ToString_abi_cxx11_
                  ((Status *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff18);
        Log(pLVar7,"Reuse MANIFEST: %s\n",pcVar6);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff18);
        if (in_RDI[0xe] != 0) {
          __assert_fail("descriptor_file_ == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                        ,0x3f3,
                        "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                       );
        }
        local_51 = false;
      }
      Status::~Status((Status *)in_stack_ffffffffffffff18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool VersionSet::ReuseManifest(const std::string& dscname,
                               const std::string& dscbase) {
  if (!options_->reuse_logs) {
    return false;
  }
  FileType manifest_type;
  uint64_t manifest_number;
  uint64_t manifest_size;
  if (!ParseFileName(dscbase, &manifest_number, &manifest_type) ||
      manifest_type != kDescriptorFile ||
      !env_->GetFileSize(dscname, &manifest_size).ok() ||
      // Make new compacted MANIFEST if old one is too big
      manifest_size >= TargetFileSize(options_)) {
    return false;
  }

  assert(descriptor_file_ == nullptr);
  assert(descriptor_log_ == nullptr);
  Status r = env_->NewAppendableFile(dscname, &descriptor_file_);
  if (!r.ok()) {
    Log(options_->info_log, "Reuse MANIFEST: %s\n", r.ToString().c_str());
    assert(descriptor_file_ == nullptr);
    return false;
  }

  Log(options_->info_log, "Reusing MANIFEST %s\n", dscname.c_str());
  descriptor_log_ = new log::Writer(descriptor_file_, manifest_size);
  manifest_file_number_ = manifest_number;
  return true;
}